

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int DisconnectP33xx(P33X *pP33x)

{
  int iVar1;
  int local_1c;
  int res;
  int id;
  P33X *pP33x_local;
  
  local_1c = 0;
  do {
    if ((P33X *)addrsP33x[local_1c] == pP33x) {
      iVar1 = DisconnectP33x(pP33x);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsP33x[local_1c] = (void *)0x0;
      return 0;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int DisconnectP33xx(P33X* pP33x)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsP33x[id] != pP33x)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = DisconnectP33x(pP33x);
	if (res != EXIT_SUCCESS) return res;

	addrsP33x[id] = NULL;

	return EXIT_SUCCESS;
}